

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf.h
# Opt level: O1

int hydro_kdf_derive_from_key
              (uint8_t *subkey,size_t subkey_len,uint64_t subkey_id,char *ctx,uint8_t *key)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  hydro_hash_state st;
  undefined1 local_a8 [4];
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined6 uStack_a0;
  undefined2 uStack_9a;
  undefined1 uStack_98;
  undefined5 uStack_97;
  undefined2 uStack_92;
  undefined1 uStack_90;
  undefined5 uStack_8f;
  undefined2 uStack_8a;
  undefined1 uStack_88;
  undefined5 uStack_87;
  undefined2 uStack_82;
  undefined1 uStack_80;
  undefined5 uStack_7f;
  undefined2 uStack_7a;
  undefined1 uStack_78;
  undefined5 uStack_77;
  undefined2 uStack_72;
  undefined6 uStack_70;
  undefined2 uStack_6a;
  undefined6 uStack_68;
  undefined2 uStack_62;
  undefined6 uStack_60;
  undefined2 local_5a;
  hydro_hash_state local_58;
  
  local_a8 = (undefined1  [4])0x616d7404;
  uStack_a4 = 0x863;
  uStack_9a = 0;
  uStack_97 = 0;
  uStack_92 = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  uStack_8a = 0;
  uStack_88 = 0;
  uStack_87 = 0;
  uStack_82 = 0;
  uStack_80 = 0;
  uStack_7f = 0;
  uStack_7a = 0;
  uStack_78 = 0;
  uStack_77 = 0;
  uStack_72 = 0;
  uStack_70 = 0;
  uStack_6a = 0;
  uStack_68 = 0;
  uStack_62 = 0;
  uStack_60 = 0;
  local_5a = 0;
  uStack_a2 = (undefined2)*(undefined8 *)ctx;
  uStack_a0 = (undefined6)((ulong)*(undefined8 *)ctx >> 0x10);
  if (key == (uint8_t *)0x0) {
    uStack_98 = 0;
    uVar6 = 0x20;
  }
  else {
    uStack_98 = 0x20;
    uVar1 = *(undefined8 *)key;
    uVar2 = *(undefined8 *)(key + 8);
    uVar3 = *(undefined8 *)(key + 0x10);
    uVar4 = *(undefined8 *)(key + 0x18);
    uStack_97 = (undefined5)uVar1;
    uStack_92 = (undefined2)((ulong)uVar1 >> 0x28);
    uStack_90 = (undefined1)((ulong)uVar1 >> 0x38);
    uStack_8f = (undefined5)uVar2;
    uStack_8a = (undefined2)((ulong)uVar2 >> 0x28);
    uStack_88 = (undefined1)((ulong)uVar2 >> 0x38);
    uStack_87 = (undefined5)uVar3;
    uStack_82 = (undefined2)((ulong)uVar3 >> 0x28);
    uStack_80 = (undefined1)((ulong)uVar3 >> 0x38);
    uStack_7f = (undefined5)uVar4;
    uStack_7a = (undefined2)((ulong)uVar4 >> 0x28);
    uStack_78 = (undefined1)((ulong)uVar4 >> 0x38);
    uVar6 = 0x40;
  }
  local_a8[uVar6] = 8;
  *(uint64_t *)(local_a8 + uVar6 + 1) = subkey_id;
  local_58.state[0] = 0;
  local_58.state[1] = 0;
  local_58.state[2] = 0;
  local_58.state[3] = 0;
  local_58.state[4] = 0;
  local_58.state[5] = 0;
  local_58.state[6] = 0;
  local_58.state[7] = 0;
  local_58.state[8] = 0;
  local_58.state[9] = 0;
  local_58.state[10] = 0;
  local_58.state[0xb] = 0;
  local_58.buf_off = '\0';
  local_58.align[0] = '\0';
  local_58.align[1] = '\0';
  local_58.align[2] = '\0';
  hydro_hash_update(&local_58,local_a8,uVar6 | 0x10);
  iVar5 = hydro_hash_final(&local_58,subkey,subkey_len);
  return iVar5;
}

Assistant:

int
hydro_kdf_derive_from_key(uint8_t *subkey, size_t subkey_len, uint64_t subkey_id,
                          const char    ctx[hydro_kdf_CONTEXTBYTES],
                          const uint8_t key[hydro_kdf_KEYBYTES])
{
    hydro_hash_state st;

    COMPILER_ASSERT(hydro_kdf_CONTEXTBYTES >= hydro_hash_CONTEXTBYTES);
    COMPILER_ASSERT(hydro_kdf_KEYBYTES >= hydro_hash_KEYBYTES);
    if (hydro_hash_init_with_tweak(&st, ctx, subkey_id, key) != 0) {
        return -1;
    }
    return hydro_hash_final(&st, subkey, subkey_len);
}